

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

bool crn_decompress_dds_to_images
               (void *pDDS_file_data,crn_uint32 dds_file_size,crn_uint32 **ppImages,
               crn_texture_desc *tex_desc)

{
  image_u8 *piVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  bool bVar3;
  crn_uint32 cVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  mipmapped_texture tex;
  data_stream_serializer in_serializer;
  buffer_stream in_stream;
  mipmapped_texture local_b0;
  data_stream_serializer local_68;
  buffer_stream local_58;
  
  tex_desc->m_faces = 0;
  tex_desc->m_width = 0;
  tex_desc->m_height = 0;
  tex_desc->m_levels = 0;
  tex_desc->m_fmt_fourcc = 0;
  crnlib::mipmapped_texture::mipmapped_texture(&local_b0);
  crnlib::buffer_stream::buffer_stream(&local_58,pDDS_file_data,dds_file_size);
  local_68.m_little_endian = true;
  local_68.m_pStream = &local_58.super_data_stream;
  bVar3 = crnlib::mipmapped_texture::read_dds(&local_b0,&local_68);
  if (bVar3) {
    bVar3 = crnlib::mipmapped_texture::is_packed(&local_b0);
    if (bVar3) {
      bVar3 = crnlib::mipmapped_texture::unpack_from_dxt(&local_b0,true);
      if (!bVar3) goto LAB_0014bce2;
    }
    tex_desc->m_faces = local_b0.m_faces.m_size;
    tex_desc->m_width = local_b0.m_width;
    tex_desc->m_height = local_b0.m_height;
    if (local_b0.m_faces.m_size == 0) {
      cVar4 = 0;
    }
    else {
      cVar4 = (local_b0.m_faces.m_p)->m_size;
    }
    tex_desc->m_levels = cVar4;
    tex_desc->m_fmt_fourcc = local_b0.m_format;
    bVar3 = true;
    if (local_b0.m_faces.m_size != 0) {
      uVar5 = 0;
      do {
        uVar6 = 0;
        while( true ) {
          if (local_b0.m_faces.m_size == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)(local_b0.m_faces.m_p)->m_size;
          }
          if (uVar7 <= uVar6) break;
          piVar1 = local_b0.m_faces.m_p[uVar5].m_p[uVar6]->m_pImage;
          pcVar2 = (piVar1->m_pixel_buf).m_p;
          (piVar1->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
          (piVar1->m_pixel_buf).m_size = 0;
          (piVar1->m_pixel_buf).m_capacity = 0;
          if (local_b0.m_faces.m_size == 0) {
            uVar8 = 0;
          }
          else {
            uVar8 = (local_b0.m_faces.m_p)->m_size;
          }
          ppImages[uVar8 * (int)uVar5 + (int)uVar6] = (crn_uint32 *)pcVar2;
          uVar6 = uVar6 + 1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_b0.m_faces.m_size);
    }
  }
  else {
LAB_0014bce2:
    bVar3 = false;
  }
  crnlib::data_stream::~data_stream(&local_58.super_data_stream);
  crnlib::mipmapped_texture::~mipmapped_texture(&local_b0);
  return bVar3;
}

Assistant:

bool crn_decompress_dds_to_images(const void* pDDS_file_data, crn_uint32 dds_file_size, crn_uint32** ppImages, crn_texture_desc& tex_desc)
{
    memset(&tex_desc, 0, sizeof(tex_desc));

    mipmapped_texture tex;
    buffer_stream in_stream(pDDS_file_data, dds_file_size);
    data_stream_serializer in_serializer(in_stream);
    if (!tex.read_dds(in_serializer))
    {
        return false;
    }

    if (tex.is_packed())
    {
        // TODO: Allow the user to disable uncooking of swizzled DXT5 formats?
        bool uncook = true;

        if (!tex.unpack_from_dxt(uncook))
        {
            return false;
        }
    }

    tex_desc.m_faces = tex.get_num_faces();
    tex_desc.m_width = tex.get_width();
    tex_desc.m_height = tex.get_height();
    tex_desc.m_levels = tex.get_num_levels();
    tex_desc.m_fmt_fourcc = (crn_uint32)tex.get_format();

    for (uint32 f = 0; f < tex.get_num_faces(); f++)
    {
        for (uint32 l = 0; l < tex.get_num_levels(); l++)
        {
            mip_level* pLevel = tex.get_level(f, l);
            image_u8* pImg = pLevel->get_image();
            ppImages[l + tex.get_num_levels() * f] = static_cast<crn_uint32*>(pImg->get_pixel_buf().assume_ownership());
        }
    }

    return true;
}